

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_compare.hpp
# Opt level: O3

bool __thiscall
jessilib::text_equali::operator()
          (text_equali *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_lhs,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_rhs)

{
  bool bVar1;
  basic_string_view<char,_std::char_traits<char>_> lhs;
  basic_string_view<char,_std::char_traits<char>_> rhs;
  
  lhs._M_str = (in_lhs->_M_dataplus)._M_p;
  lhs._M_len = in_lhs->_M_string_length;
  rhs._M_str = (in_rhs->_M_dataplus)._M_p;
  rhs._M_len = in_rhs->_M_string_length;
  bVar1 = equalsi<char,char>(lhs,rhs);
  return bVar1;
}

Assistant:

bool operator()(const std::basic_string<LhsCharT>& in_lhs, const std::basic_string<RhsCharT>& in_rhs) const noexcept {
		return equalsi<LhsCharT, RhsCharT>(in_lhs, in_rhs);
	}